

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionStats::~AssertionStats(AssertionStats *this)

{
  AssertionResult *in_RDI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *unaff_retaddr;
  
  (in_RDI->m_info).macroName.m_start = (char *)&PTR__AssertionStats_00263e98;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (unaff_retaddr);
  AssertionResult::~AssertionResult(in_RDI);
  return;
}

Assistant:

AssertionStats::~AssertionStats() = default;